

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::getCanonStartSet(Normalizer2Impl *this,UChar32 c,UnicodeSet *set)

{
  uint16_t norm16_00;
  uint uVar1;
  uint c_00;
  int iVar2;
  UnicodeSet *c_01;
  uint16_t *list;
  UChar32 syllable;
  uint16_t norm16;
  int32_t value;
  int32_t canonValue;
  UnicodeSet *set_local;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  uVar1 = getCanonValue(this,c);
  if ((uVar1 & 0x7fffffff) == 0) {
    this_local._7_1_ = '\0';
  }
  else {
    UnicodeSet::clear(set);
    c_00 = uVar1 & 0x1fffff;
    if ((uVar1 & 0x200000) == 0) {
      if (c_00 != 0) {
        UnicodeSet::add(set,c_00);
      }
    }
    else {
      c_01 = getCanonStartSet(this,c_00);
      UnicodeSet::addAll(set,c_01);
    }
    if ((uVar1 & 0x40000000) != 0) {
      norm16_00 = getRawNorm16(this,c);
      if (norm16_00 == 2) {
        iVar2 = (c + -0x1100) * 0x24c;
        UnicodeSet::add(set,iVar2 + 0xac00,iVar2 + 0xae4b);
      }
      else {
        list = getCompositionsList(this,norm16_00);
        addComposites(this,list,set);
      }
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::getCanonStartSet(UChar32 c, UnicodeSet &set) const {
    int32_t canonValue=getCanonValue(c)&~CANON_NOT_SEGMENT_STARTER;
    if(canonValue==0) {
        return FALSE;
    }
    set.clear();
    int32_t value=canonValue&CANON_VALUE_MASK;
    if((canonValue&CANON_HAS_SET)!=0) {
        set.addAll(getCanonStartSet(value));
    } else if(value!=0) {
        set.add(value);
    }
    if((canonValue&CANON_HAS_COMPOSITIONS)!=0) {
        uint16_t norm16=getRawNorm16(c);
        if(norm16==JAMO_L) {
            UChar32 syllable=
                (UChar32)(Hangul::HANGUL_BASE+(c-Hangul::JAMO_L_BASE)*Hangul::JAMO_VT_COUNT);
            set.add(syllable, syllable+Hangul::JAMO_VT_COUNT-1);
        } else {
            addComposites(getCompositionsList(norm16), set);
        }
    }
    return TRUE;
}